

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O2

bool __thiscall ExternalTester::testAllWavelet(ExternalTester *this)

{
  TwoOneExpNX2 *f;
  double dVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  int i;
  long lVar6;
  long lVar7;
  int i_1;
  int j;
  long lVar8;
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> pnts;
  vector<double,_std::allocator<double>_> vals;
  vector<int,_std::allocator<int>_> pntr;
  vector<int,_std::allocator<int>_> indx;
  vector<double,_std::allocator<double>_> v;
  _Vector_base<double,_std::allocator<double>_> local_c8;
  TasmanianSparseGrid grid;
  
  f = &this->f21nx2;
  bVar2 = testLocalWaveletRule
                    (this,&f->super_BaseFunction,(int *)&DAT_0012dcb0,(double *)&DAT_0012dce0,true);
  if ((bVar2) &&
     (bVar2 = testLocalWaveletRule
                        (this,&f->super_BaseFunction,(int *)&DAT_0012dcb0,(double *)&DAT_0012dce0,
                         false), bVar2)) {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0xb;
    poVar4 = std::operator<<((ostream *)&std::cout,"Rules");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
    poVar4 = std::operator<<(poVar4,"wavelet");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
    poVar4 = std::operator<<(poVar4,"Pass");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar2 = true;
  }
  else {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0xb;
    poVar4 = std::operator<<((ostream *)&std::cout,"Rule");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
    TasGrid::IO::getRuleString_abi_cxx11_
              (y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start._4_4_);
    poVar4 = std::operator<<(poVar4,(string *)&grid);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
    poVar4 = std::operator<<(poVar4,"FAIL");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&grid);
    bVar2 = false;
  }
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(&grid);
  TasGrid::TasmanianSparseGrid::makeWaveletGrid((int)&grid,2,1,2,(int *)0x1);
  indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  genRandom(&pnts,10,2);
  TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctions
            ((vector *)&grid,(vector *)&pnts,(vector *)&pntr,(vector *)&indx);
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getError(this,&f->super_BaseFunction,&grid,type_internal_interpolation,&y);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y.super__Vector_base<double,_std::allocator<double>_>);
  lVar5 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
  std::vector<double,_std::allocator<double>_>::vector(&y,10,(allocator_type *)&v);
  TasGrid::TasmanianSparseGrid::evaluateBatch
            ((double *)&grid,
             (int)pnts.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,(double *)0xa);
  lVar6 = 0;
  while (lVar8 = lVar6, lVar8 != 10) {
    iVar3 = pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar8 + 1];
    for (lVar7 = (long)pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8]; lVar6 = lVar8 + 1, lVar7 < iVar3;
        lVar7 = lVar7 + 1) {
      y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar8] = y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8] -
                *(double *)
                 (lVar5 + (long)indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar7] * 8) *
                vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
    }
  }
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    if (1e-12 < ABS(y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6])) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Error in evaluateSparseHierarchicalFunctions() (wavelet)");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::ostream::_M_insert<double>
                         (y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6]);
      std::endl<char,std::char_traits<char>>(poVar4);
      bVar2 = false;
    }
  }
  iVar3 = TasGrid::TasmanianSparseGrid::getNumPoints(&grid);
  std::vector<double,_std::allocator<double>_>::vector
            (&v,(long)(iVar3 * 10),(allocator_type *)&local_c8);
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getError(this,&f->super_BaseFunction,&grid,type_internal_interpolation,
           (vector<double,_std::allocator<double>_> *)&local_c8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c8);
  TasGrid::TasmanianSparseGrid::evaluateHierarchicalFunctions((vector *)&grid,(vector *)&pnts);
  lVar6 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
  TasGrid::TasmanianSparseGrid::evaluateBatch
            ((double *)&grid,
             (int)pnts.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,(double *)0xa);
  for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
    for (lVar8 = 0; iVar3 = TasGrid::TasmanianSparseGrid::getNumPoints(&grid), lVar8 < iVar3;
        lVar8 = lVar8 + 1) {
      dVar1 = *(double *)(lVar6 + lVar8 * 8);
      iVar3 = TasGrid::TasmanianSparseGrid::getNumPoints(&grid);
      y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar5] = y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5] -
                dVar1 * v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar3 * (int)lVar5 + (int)lVar8];
    }
  }
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    if (1e-12 < ABS(y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6])) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Error in getHierarchicalCoefficients() (wavelet)");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::ostream::_M_insert<double>
                         (y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6]);
      std::endl<char,std::char_traits<char>>(poVar4);
      bVar2 = false;
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&pnts.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vals.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&pntr.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indx.super__Vector_base<int,_std::allocator<int>_>);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&grid);
  return bVar2;
}

Assistant:

bool ExternalTester::testAllWavelet() const{
    bool pass = true;
    // Depths and tolerances for quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
    const int depths1[10] = { 7, 7, 7, 7, 7, // order 1
                              5, 5, 5, 5, 5 }; // order 3
    const double tols1[10] = { 5.E-05, 1.E-04, 1.E-04, 5E-02, 5E-02, // order 1
                               1.E-08, 1.E-07, 1.E-07, 5E-05, 5E-05 }; // order 3
    int wfirst = 11, wsecond = 34, wthird = 15;
    if (testLocalWaveletRule(&f21nx2, depths1, tols1, true) and testLocalWaveletRule(&f21nx2, depths1, tols1, false)){
        cout << setw(wfirst) << "Rules" << setw(wsecond) << "wavelet" << setw(wthird) << "Pass" << endl;
    }else{
        cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(rule_wavelet) << setw(wthird) << "FAIL" << endl; pass = false;
    }{ TasGrid::TasmanianSparseGrid grid;
        grid.makeWaveletGrid(2, 1, 2, 1);
        std::vector<int> indx, pntr;
        std::vector<double> vals;
        std::vector<double> pnts = genRandom(10, 2);
        grid.evaluateSparseHierarchicalFunctions(pnts, pntr, indx, vals);
        getError(&f21nx2, grid, type_internal_interpolation); // this is done to load the values
        const double *coeff = grid.getHierarchicalCoefficients();
        std::vector<double> y(10);
        grid.evaluateBatch(pnts.data(), 10, y.data());
        for(int i=0; i<10; i++){
            for(int j=pntr[i]; j<pntr[i+1]; j++){
                y[i] -= coeff[indx[j]] * vals[j];
            }
        }
        for(int i=0; i<10; i++){
            if (std::abs(y[i]) > Maths::num_tol){
                cout << "Error in evaluateSparseHierarchicalFunctions() (wavelet)" << endl;
                cout << y[i] << endl;
                pass = false;
            }
        }
        std::vector<double> v(10 * grid.getNumPoints());
        getError(&f21nx2, grid, type_internal_interpolation);
        grid.evaluateHierarchicalFunctions(pnts, v);
        coeff = grid.getHierarchicalCoefficients();
        grid.evaluateBatch(pnts.data(), 10, y.data());
        for(int i=0; i<10; i++){
            for(int j=0; j<grid.getNumPoints(); j++){
                y[i] -= coeff[j] * v[i*grid.getNumPoints() + j];
            }
        }
        for(int i=0; i<10; i++){
            if (std::abs(y[i]) > Maths::num_tol){
                cout << "Error in getHierarchicalCoefficients() (wavelet)" << endl;
                cout << y[i] << endl;
                pass = false;
            }
        }
    }
    return pass;
}